

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_version(void)

{
  float version;
  char cfitsioversion [40];
  
  fp_msg("1.7.0 (Dec 2013)");
  ffvers(&version);
  snprintf(cfitsioversion,0x28," CFITSIO version %5.3f",(double)version);
  fp_msg(cfitsioversion);
  fp_msg("\n");
  return 0;
}

Assistant:

int fp_version (void)
{
        float version;
        char cfitsioversion[40];

        fp_msg (FPACK_VERSION);
        fits_get_version(&version);
        snprintf(cfitsioversion, 40," CFITSIO version %5.3f", version);
        fp_msg(cfitsioversion);
        fp_msg ("\n");
        return(0);
}